

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

void parse_charstrings(T1_Face face,T1_Loader loader)

{
  uint uVar1;
  int iVar2;
  FT_Long FVar3;
  FT_Memory extraout_RDX;
  char *notdef_name;
  T1_Loader pTStack_90;
  FT_Byte notdef_glyph [5];
  FT_Byte *temp;
  FT_Byte *pFStack_80;
  FT_UInt len;
  FT_Byte *base;
  FT_ULong size;
  int iStack_68;
  FT_Byte notdef_found;
  FT_Int notdef_index;
  FT_Int num_glyphs;
  FT_Int n;
  FT_Byte *limit;
  FT_Byte *cur;
  PSAux_Service psaux;
  FT_Memory pFStack_40;
  FT_Error error;
  FT_Memory memory;
  PS_Table swap_table;
  PS_Table name_table;
  PS_Table code_table;
  T1_Parser parser;
  T1_Loader loader_local;
  T1_Face face_local;
  
  name_table = &loader->charstrings;
  swap_table = &loader->glyph_names;
  memory = (FT_Memory)&loader->swap_table;
  pFStack_40 = (loader->parser).root.memory;
  cur = (FT_Byte *)face->psaux;
  limit = (loader->parser).root.cursor;
  _num_glyphs = (loader->parser).root.limit;
  size._4_4_ = 0;
  size._3_1_ = '\0';
  code_table = (PS_Table)loader;
  parser = &loader->parser;
  loader_local = (T1_Loader)face;
  FVar3 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  iStack_68 = (int)FVar3;
  if (iStack_68 < 0) {
    psaux._4_4_ = 3;
    goto LAB_0035066f;
  }
  if ((long)_num_glyphs - (long)limit >> 3 < (long)iStack_68) {
    iStack_68 = (int)((long)_num_glyphs - (long)limit >> 3);
  }
  if (iStack_68 == 0) {
    return;
  }
  if ((int)code_table->init != 0) {
    return;
  }
  if (*(int *)&parser[1].root.funcs.to_fixed_array == 0) {
    psaux._4_4_ = (*(code *)**(undefined8 **)cur)(name_table,iStack_68 + 6,pFStack_40);
    if ((psaux._4_4_ != 0) ||
       (psaux._4_4_ = (*(code *)**(undefined8 **)cur)(swap_table,iStack_68 + 6,pFStack_40),
       psaux._4_4_ != 0)) goto LAB_0035066f;
    loader = (T1_Loader)0x4;
    psaux._4_4_ = (*(code *)**(undefined8 **)cur)(memory,4,pFStack_40);
    if (psaux._4_4_ != 0) goto LAB_0035066f;
    psaux._4_4_ = 0;
  }
  notdef_index = 0;
  while( true ) {
    (*(code *)code_table->memory)(code_table);
    limit = code_table->block;
    if ((_num_glyphs <= limit) ||
       (((limit + 3 < _num_glyphs &&
         (((((((limit[3] == ' ' || (limit[3] == '\r')) || (limit[3] == '\n')) ||
             ((limit[3] == '\t' || (limit[3] == '\f')))) || (limit[3] == '\0')) ||
           (((limit[3] == '/' || (limit[3] == '(')) ||
            ((limit[3] == ')' || (((limit[3] == '<' || (limit[3] == '>')) || (limit[3] == '[')))))))
           ) || (((limit[3] == ']' || (limit[3] == '{')) || ((limit[3] == '}' || (limit[3] == '%')))
                 ))))) &&
        ((((*limit == 'd' && (limit[1] == 'e')) && ((limit[2] == 'f' && (notdef_index != 0)))) ||
         (((*limit == 'e' && (limit[1] == 'n')) && (limit[2] == 'd')))))))) break;
    (*(code_table->funcs).init)(code_table,(FT_Int)loader,extraout_RDX);
    if (_num_glyphs <= code_table->block) {
      psaux._4_4_ = 3;
      goto LAB_0035066f;
    }
    if ((int)code_table->init != 0) {
      return;
    }
    if (*limit == '/') {
      if (_num_glyphs <= limit + 2) {
        psaux._4_4_ = 3;
        goto LAB_0035066f;
      }
      limit = limit + 1;
      uVar1 = (int)code_table->block - (int)limit;
      loader = (T1_Loader)&base;
      iVar2 = read_binary_data((T1_Parser)code_table,(FT_ULong *)loader,&stack0xffffffffffffff80,
                               (loader_local->encoding_table).elements[0xd] != (FT_Byte *)0x0);
      if (iVar2 == 0) {
        return;
      }
      if (*(int *)&parser[1].root.funcs.to_fixed_array == 0) {
        psaux._4_4_ = (*(swap_table->funcs).add)(swap_table,notdef_index,limit,uVar1 + 1);
        if (psaux._4_4_ != 0) goto LAB_0035066f;
        swap_table->elements[notdef_index][uVar1] = '\0';
        if ((*limit == '.') &&
           (iVar2 = strcmp(".notdef",(char *)swap_table->elements[notdef_index]), iVar2 == 0)) {
          size._4_4_ = notdef_index;
          size._3_1_ = '\x01';
        }
        if ((*(int *)((long)&(loader_local->glyph_names).cursor + 4) < 0) ||
           (iStack_68 + 5 <= notdef_index)) {
          loader = (T1_Loader)(ulong)(uint)notdef_index;
          psaux._4_4_ = (*(name_table->funcs).add)(name_table,notdef_index,pFStack_80,(FT_UInt)base)
          ;
        }
        else {
          pTStack_90 = (T1_Loader)0x0;
          if (base <= (FT_Byte *)(long)*(int *)((long)&(loader_local->glyph_names).cursor + 4)) {
            psaux._4_4_ = 3;
            goto LAB_0035066f;
          }
          pTStack_90 = (T1_Loader)
                       ft_mem_alloc(pFStack_40,(FT_Long)base,(FT_Error *)((long)&psaux + 4));
          if (psaux._4_4_ != 0) goto LAB_0035066f;
          memcpy(pTStack_90,pFStack_80,(size_t)base);
          (**(code **)(cur + 0x20))(pTStack_90,base,0x10ea);
          base = base + -(long)*(int *)((long)&(loader_local->glyph_names).cursor + 4);
          psaux._4_4_ = (*(name_table->funcs).add)
                                  (name_table,notdef_index,
                                   (void *)((long)&(pTStack_90->parser).root.cursor +
                                           (long)*(int *)((long)&(loader_local->glyph_names).cursor
                                                         + 4)),(FT_UInt)base);
          loader = pTStack_90;
          ft_mem_free(pFStack_40,pTStack_90);
          pTStack_90 = (T1_Loader)0x0;
        }
        if (psaux._4_4_ != 0) goto LAB_0035066f;
        notdef_index = notdef_index + 1;
      }
    }
  }
  if (notdef_index == 0) {
    psaux._4_4_ = 3;
  }
  else {
    *(FT_Int *)&parser[1].root.funcs.to_fixed_array = notdef_index;
    if ((size._3_1_ == '\0') ||
       (iVar2 = strcmp(".notdef",(char *)*swap_table->elements), iVar2 == 0)) {
      if (size._3_1_ != '\0') {
        return;
      }
      notdef_name._3_4_ = 0xde1f78b;
      notdef_name._7_1_ = 0xe;
      psaux._4_4_ = (*memory[2].free)(memory,(void *)0x0);
      if (((psaux._4_4_ == 0) &&
          (psaux._4_4_ = (*memory[2].free)(memory,(void *)0x1), psaux._4_4_ == 0)) &&
         ((psaux._4_4_ = (*(swap_table->funcs).add)(swap_table,0,".notdef",8), psaux._4_4_ == 0 &&
          (((psaux._4_4_ = (*(name_table->funcs).add)
                                     (name_table,0,(void *)((long)&notdef_name + 3),5),
            psaux._4_4_ == 0 &&
            (psaux._4_4_ = (*(swap_table->funcs).add)
                                     (swap_table,notdef_index,*(void **)memory[1].alloc,
                                      *(FT_UInt *)memory[1].free), psaux._4_4_ == 0)) &&
           (psaux._4_4_ = (*(name_table->funcs).add)
                                    (name_table,notdef_index,*(void **)(memory[1].alloc + 8),
                                     *(FT_UInt *)(memory[1].free + 4)), psaux._4_4_ == 0)))))) {
        *(int *)&parser[1].root.funcs.to_fixed_array =
             *(int *)&parser[1].root.funcs.to_fixed_array + 1;
        return;
      }
    }
    else {
      psaux._4_4_ = (*memory[2].free)(memory,(void *)0x0);
      if ((((psaux._4_4_ == 0) &&
           (psaux._4_4_ = (*memory[2].free)(memory,(void *)0x1), psaux._4_4_ == 0)) &&
          ((psaux._4_4_ = (*memory[2].free)(memory,(void *)0x2), psaux._4_4_ == 0 &&
           ((psaux._4_4_ = (*memory[2].free)(memory,(void *)0x3), psaux._4_4_ == 0 &&
            (psaux._4_4_ = (*(swap_table->funcs).add)
                                     (swap_table,size._4_4_,*(void **)memory[1].alloc,
                                      *(FT_UInt *)memory[1].free), psaux._4_4_ == 0)))))) &&
         ((psaux._4_4_ = (*(name_table->funcs).add)
                                   (name_table,size._4_4_,*(void **)(memory[1].alloc + 8),
                                    *(FT_UInt *)(memory[1].free + 4)), psaux._4_4_ == 0 &&
          ((psaux._4_4_ = (*(swap_table->funcs).add)
                                    (swap_table,0,*(void **)(memory[1].alloc + 0x10),
                                     *(FT_UInt *)(memory[1].free + 8)), psaux._4_4_ == 0 &&
           (psaux._4_4_ = (*(name_table->funcs).add)
                                    (name_table,0,*(void **)(memory[1].alloc + 0x18),
                                     *(FT_UInt *)(memory[1].free + 0xc)), psaux._4_4_ == 0)))))) {
        return;
      }
    }
  }
LAB_0035066f:
  *(int *)&code_table->init = psaux._4_4_;
  return;
}

Assistant:

static void
  parse_charstrings( T1_Face    face,
                     T1_Loader  loader )
  {
    T1_Parser      parser       = &loader->parser;
    PS_Table       code_table   = &loader->charstrings;
    PS_Table       name_table   = &loader->glyph_names;
    PS_Table       swap_table   = &loader->swap_table;
    FT_Memory      memory       = parser->root.memory;
    FT_Error       error;

    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Byte*       cur          = parser->root.cursor;
    FT_Byte*       limit        = parser->root.limit;
    FT_Int         n, num_glyphs;
    FT_Int         notdef_index = 0;
    FT_Byte        notdef_found = 0;


    num_glyphs = (FT_Int)T1_ToInt( parser );
    if ( num_glyphs < 0 )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    /* we certainly need more than 8 bytes per glyph */
    if ( num_glyphs > ( limit - cur ) >> 3 )
    {
      FT_TRACE0(( "parse_charstrings: adjusting number of glyphs"
                  " (from %d to %d)\n",
                  num_glyphs, ( limit - cur ) >> 3 ));
      num_glyphs = ( limit - cur ) >> 3;
    }

    /* some fonts like Optima-Oblique not only define the /CharStrings */
    /* array but access it also                                        */
    if ( num_glyphs == 0 || parser->root.error )
      return;

    /* initialize tables, leaving space for addition of .notdef, */
    /* if necessary, and a few other glyphs to handle buggy      */
    /* fonts which have more glyphs than specified.              */

    /* for some non-standard fonts like `Optima' which provides  */
    /* different outlines depending on the resolution it is      */
    /* possible to get here twice                                */
    if ( !loader->num_glyphs )
    {
      error = psaux->ps_table_funcs->init(
                code_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      error = psaux->ps_table_funcs->init(
                name_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      /* Initialize table for swapping index notdef_index and */
      /* index 0 names and codes (if necessary).              */

      error = psaux->ps_table_funcs->init( swap_table, 4, memory );
      if ( error )
        goto Fail;
    }

    n = 0;

    for (;;)
    {
      FT_ULong  size;
      FT_Byte*  base;


      /* the format is simple:        */
      /*   `/glyphname' + binary data */

      T1_Skip_Spaces( parser );

      cur = parser->root.cursor;
      if ( cur >= limit )
        break;

      /* we stop when we find a `def' or `end' keyword */
      if ( cur + 3 < limit && IS_PS_DELIM( cur[3] ) )
      {
        if ( cur[0] == 'd' &&
             cur[1] == 'e' &&
             cur[2] == 'f' )
        {
          /* There are fonts which have this: */
          /*                                  */
          /*   /CharStrings 118 dict def      */
          /*   Private begin                  */
          /*   CharStrings begin              */
          /*   ...                            */
          /*                                  */
          /* To catch this we ignore `def' if */
          /* no charstring has actually been  */
          /* seen.                            */
          if ( n )
            break;
        }

        if ( cur[0] == 'e' &&
             cur[1] == 'n' &&
             cur[2] == 'd' )
          break;
      }

      T1_Skip_PS_Token( parser );
      if ( parser->root.cursor >= limit )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      if ( parser->root.error )
        return;

      if ( *cur == '/' )
      {
        FT_UInt  len;


        if ( cur + 2 >= limit )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        cur++;                              /* skip `/' */
        len = (FT_UInt)( parser->root.cursor - cur );

        if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
          return;

        /* for some non-standard fonts like `Optima' which provides */
        /* different outlines depending on the resolution it is     */
        /* possible to get here twice                               */
        if ( loader->num_glyphs )
          continue;

        error = T1_Add_Table( name_table, n, cur, len + 1 );
        if ( error )
          goto Fail;

        /* add a trailing zero to the name table */
        name_table->elements[n][len] = '\0';

        /* record index of /.notdef */
        if ( *cur == '.'                                              &&
             ft_strcmp( ".notdef",
                        (const char*)(name_table->elements[n]) ) == 0 )
        {
          notdef_index = n;
          notdef_found = 1;
        }

        if ( face->type1.private_dict.lenIV >= 0 &&
             n < num_glyphs + TABLE_EXTEND       )
        {
          FT_Byte*  temp = NULL;


          if ( size <= (FT_ULong)face->type1.private_dict.lenIV )
          {
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }

          /* t1_decrypt() shouldn't write to base -- make temporary copy */
          if ( FT_ALLOC( temp, size ) )
            goto Fail;
          FT_MEM_COPY( temp, base, size );
          psaux->t1_decrypt( temp, size, 4330 );
          size -= (FT_ULong)face->type1.private_dict.lenIV;
          error = T1_Add_Table( code_table, n,
                                temp + face->type1.private_dict.lenIV, size );
          FT_FREE( temp );
        }
        else
          error = T1_Add_Table( code_table, n, base, size );
        if ( error )
          goto Fail;

        n++;
      }
    }

    if ( !n )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    loader->num_glyphs = n;

    /* if /.notdef is found but does not occupy index 0, do our magic. */
    if ( notdef_found                                                 &&
         ft_strcmp( ".notdef", (const char*)name_table->elements[0] ) )
    {
      /* Swap glyph in index 0 with /.notdef glyph.  First, add index 0  */
      /* name and code entries to swap_table.  Then place notdef_index   */
      /* name and code entries into swap_table.  Then swap name and code */
      /* entries at indices notdef_index and 0 using values stored in    */
      /* swap_table.                                                     */

      /* Index 0 name */
      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index 0 code */
      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index notdef_index name */
      error = T1_Add_Table( swap_table, 2,
                            name_table->elements[notdef_index],
                            name_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      /* Index notdef_index code */
      error = T1_Add_Table( swap_table, 3,
                            code_table->elements[notdef_index],
                            code_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, notdef_index,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, notdef_index,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0,
                            swap_table->elements[2],
                            swap_table->lengths [2] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0,
                            swap_table->elements[3],
                            swap_table->lengths [3] );
      if ( error )
        goto Fail;

    }
    else if ( !notdef_found )
    {
      /* notdef_index is already 0, or /.notdef is undefined in   */
      /* charstrings dictionary.  Worry about /.notdef undefined. */
      /* We take index 0 and add it to the end of the table(s)    */
      /* and add our own /.notdef glyph to index 0.               */

      /* 0 333 hsbw endchar */
      FT_Byte  notdef_glyph[] = { 0x8B, 0xF7, 0xE1, 0x0D, 0x0E };
      char*    notdef_name    = (char *)".notdef";


      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0, notdef_name, 8 );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0, notdef_glyph, 5 );

      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, n,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, n,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      /* we added a glyph. */
      loader->num_glyphs += 1;
    }

    return;

  Fail:
    parser->root.error = error;
  }